

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_struct_padding_target(CompilerMSL *this,SPIRType *type)

{
  uint32_t id;
  CompilerError *this_00;
  uint local_30 [4];
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t target_size;
  uint32_t struct_size;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  _target_size = type;
  type_local = (SPIRType *)this;
  local_1c = get_declared_struct_size_msl(this,type,true,true);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(_target_size->super_IVariant).self);
  local_20 = Compiler::get_extended_decoration
                       ((Compiler *)this,id,SPIRVCrossDecorationPaddingTarget);
  if (local_20 < local_1c) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot pad with negative bytes.");
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (local_1c < local_20) {
    local_30[0] = local_20 - local_1c;
    CompilerGLSL::statement<char_const(&)[24],unsigned_int,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [24])"char _m0_final_padding[",local_30,
               (char (*) [3])0x40e4c1);
  }
  return;
}

Assistant:

void CompilerMSL::emit_struct_padding_target(const SPIRType &type)
{
	uint32_t struct_size = get_declared_struct_size_msl(type, true, true);
	uint32_t target_size = get_extended_decoration(type.self, SPIRVCrossDecorationPaddingTarget);
	if (target_size < struct_size)
		SPIRV_CROSS_THROW("Cannot pad with negative bytes.");
	else if (target_size > struct_size)
		statement("char _m0_final_padding[", target_size - struct_size, "];");
}